

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O1

void benchmark(tlpperf *t)

{
  int iVar1;
  ulong uVar2;
  __sighandler_t p_Var3;
  char *__s;
  undefined8 *__s_00;
  pthread_t *ppVar4;
  long lVar5;
  pthread_t ctid;
  tlpperf_thread ths [16];
  pthread_t local_5b0;
  undefined8 local_5a8;
  pthread_t local_5a0 [176];
  
  iVar1 = pthread_create(&local_5b0,(pthread_attr_t *)0x0,count_thread,&local_5a8);
  if (iVar1 < 0) {
    benchmark_cold_3();
    fprintf(_stdout,"%s: stopping...\n","stop_all");
    caught_signal = 1;
    return;
  }
  __s_00 = &local_5a8;
  memset(__s_00,0,0x580);
  if (0 < t->nthreads) {
    lVar5 = 0;
    do {
      *__s_00 = t;
      *(in_addr_t *)(__s_00 + 2) = (t->remote).s_addr;
      *(in_addr_t *)((long)__s_00 + 0x14) = (t->local).s_addr;
      *(uint16_t *)(__s_00 + 3) = t->requester;
      *(char *)((long)__s_00 + 0x1a) = (char)lVar5;
      iVar1 = nettlp_init((nettlp *)(__s_00 + 2));
      if (iVar1 < 0) {
        __s = "nettlp_init";
        goto LAB_0010301e;
      }
      *(int *)(__s_00 + 5) = (int)lVar5;
      *(int *)(__s_00 + 10) = t->count;
      if (t->split == 1) {
        uVar2 = t->region_size / (ulong)(long)t->nthreads;
        __s_00[6] = uVar2 * lVar5 + t->region_addr & 0xfffffffffffff000;
      }
      else {
        if (t->split != 0) {
          benchmark_cold_2();
          return;
        }
        __s_00[6] = t->region_addr;
        uVar2 = t->region_size;
      }
      __s_00[7] = uVar2;
      iVar1 = pthread_create(__s_00 + 1,(pthread_attr_t *)0x0,benchmark_thread,__s_00);
      if (iVar1 < 0) {
        benchmark_cold_1();
        return;
      }
      usleep(0x14);
      lVar5 = lVar5 + 1;
      __s_00 = __s_00 + 0xb;
    } while (lVar5 < t->nthreads);
  }
  p_Var3 = signal(2,stop_all);
  if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
    __s = "cannot set seginal\n";
LAB_0010301e:
    perror(__s);
  }
  else {
    if (0 < t->nthreads) {
      ppVar4 = local_5a0;
      lVar5 = 0;
      do {
        pthread_join(*ppVar4,(void **)0x0);
        lVar5 = lVar5 + 1;
        ppVar4 = ppVar4 + 0xb;
      } while (lVar5 < t->nthreads);
    }
    pthread_join(local_5b0,(void **)0x0);
  }
  return;
}

Assistant:

void benchmark(struct tlpperf *t)
{
	int n;
	pthread_t ctid;	/* count_thread tid */
	struct tlpperf_thread ths[MAX_CPUS];

	if (pthread_create(&ctid, NULL, count_thread, ths) < 0) {
		pr_err("failed to create count thread\n");
		perror("pthread_create");
		exit(-1);
	}

	memset(ths, 0, sizeof(ths));

	for (n = 0; n < t->nthreads; n++) {
		struct tlpperf_thread *th = &ths[n];

		th->t = t;

		/* initialize nettlp for this thread */
		th->nt.remote_addr = t->remote;
		th->nt.local_addr = t->local;
		th->nt.requester = t->requester;
		th->nt.tag = n;	/* XXX */
		if (nettlp_init(&th->nt) < 0) {
			perror("nettlp_init");
			return;
		}

		/* fill the thread-specific parameters */
		th->cpu = n;	/* XXX */
		th->count = t->count;
		if (t->split == DMA_REGION_SPLIT_SAME) {
			th->region_addr = t->region_addr;
			th->region_size = t->region_size;
		} else if (t->split == DMA_REGION_SPLIT_DIFF) {
			th->region_addr = ((t->region_addr +
					    t->region_size / t->nthreads * n)
					   >> 12) << 12; /* 4k-byte align */
			th->region_size = t->region_size / t->nthreads;
		} else {
			pr_err("invalid region split pattern\n");
			return;
		}
		
		if (pthread_create(&th->tid, NULL, benchmark_thread, th) < 0) {
			pr_err("failed to create thread for cpu %d\n", n);
			perror("pthread_create");
			return;
		}

		usleep(20);	/* to serialize start output on each thread */
	}

	if (signal(SIGINT, stop_all) == SIG_ERR) {
		perror("cannot set seginal\n");
		return;
	}
	
	for (n = 0; n < t->nthreads; n++)
		pthread_join(ths[n].tid, NULL);
		
	pthread_join(ctid, NULL);

	return;
}